

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O0

char * IoTHubAccount_GetEventhubAccessKey(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  int iVar1;
  char *pcVar2;
  STRING_HANDLE handle;
  STRING_TOKENIZER_HANDLE_conflict tokenizer_00;
  STRING_HANDLE output;
  char local_b8 [8];
  char tokenValue [128];
  STRING_HANDLE valueString;
  STRING_HANDLE tokenString;
  STRING_TOKENIZER_HANDLE tokenizer;
  STRING_HANDLE iothub_connection_string_str;
  char *iothub_connection_string;
  IOTHUB_ACCOUNT_INFO_HANDLE acctHandle_local;
  
  pcVar2 = IoTHubAccount_GetIoTHubConnString(acctHandle);
  if ((pcVar2 != (char *)0x0) && (handle = STRING_construct(pcVar2), handle != (STRING_HANDLE)0x0))
  {
    tokenizer_00 = STRING_TOKENIZER_create(handle);
    if (tokenizer_00 != (STRING_TOKENIZER_HANDLE_conflict)0x0) {
      output = STRING_new();
      if (output != (STRING_HANDLE)0x0) {
        tokenValue._120_8_ = STRING_new();
        if ((STRING_HANDLE)tokenValue._120_8_ != (STRING_HANDLE)0x0) {
          do {
            iVar1 = STRING_TOKENIZER_get_next_token(tokenizer_00,output,"=");
            if (iVar1 != 0) goto LAB_0011f9bd;
            pcVar2 = STRING_c_str(output);
            strcpy(local_b8,pcVar2);
            iVar1 = STRING_TOKENIZER_get_next_token(tokenizer_00,output,";");
            if (iVar1 != 0) goto LAB_0011f9bd;
            iVar1 = strcmp(local_b8,"SharedAccessKey");
          } while (iVar1 != 0);
          pcVar2 = STRING_c_str(output);
          strcpy(IoTHubAccount_GetEventhubAccessKey::access_key,pcVar2);
LAB_0011f9bd:
          STRING_delete((STRING_HANDLE)tokenValue._120_8_);
        }
        STRING_delete(output);
      }
      STRING_TOKENIZER_destroy(tokenizer_00);
    }
    STRING_delete(handle);
  }
  return IoTHubAccount_GetEventhubAccessKey::access_key;
}

Assistant:

const char* IoTHubAccount_GetEventhubAccessKey(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    const char *iothub_connection_string;
    static char access_key[128];

    if ((iothub_connection_string = IoTHubAccount_GetIoTHubConnString(acctHandle)) != NULL)
    {
        STRING_HANDLE iothub_connection_string_str;

        if ((iothub_connection_string_str = STRING_construct(iothub_connection_string)) != NULL)
        {
            STRING_TOKENIZER_HANDLE tokenizer;

            if ((tokenizer = STRING_TOKENIZER_create(iothub_connection_string_str)) != NULL)
            {
                STRING_HANDLE tokenString;

                if ((tokenString = STRING_new()) != NULL)
                {
                    STRING_HANDLE valueString;

                    if ((valueString = STRING_new()) != NULL)
                    {
                        while ((STRING_TOKENIZER_get_next_token(tokenizer, tokenString, "=") == 0))
                        {
                            char tokenValue[128];
                            strcpy(tokenValue, STRING_c_str(tokenString));

                            if (STRING_TOKENIZER_get_next_token(tokenizer, tokenString, ";") != 0)
                            {
                                break;
                            }

                            if (strcmp(tokenValue, "SharedAccessKey") == 0)
                            {
                                strcpy(access_key, STRING_c_str(tokenString));
                                break;
                            }
                        }

                        STRING_delete(valueString);
                    }

                    STRING_delete(tokenString);
                }

                STRING_TOKENIZER_destroy(tokenizer);
            }

            STRING_delete(iothub_connection_string_str);
        }
    }

    return access_key;
}